

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35d0fd::DirectoryInputNodeTask::start
          (DirectoryInputNodeTask *this,TaskInterface ti)

{
  StringRef *pSVar1;
  StringRef str;
  TaskInterface ti_00;
  StringRef *pSVar2;
  TaskInterface local_80;
  BuildKey local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_80.ctx = ti.ctx;
  local_80.impl = ti.impl;
  pSVar2 = (this->node->mustScanAfterPaths).
           super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (this->node->mustScanAfterPaths).
           super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar2 != pSVar1) {
    do {
      str = *pSVar2;
      this->totalBlockingDeps = this->totalBlockingDeps + 1;
      llbuild::buildsystem::BuildKey::BuildKey(&local_70,'N',str);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_70.key.key._M_dataplus._M_p,
                 local_70.key.key._M_dataplus._M_p + local_70.key.key._M_string_length);
      llbuild::core::TaskInterface::request
                (&local_80,(KeyType *)local_50,(long)this->totalBlockingDeps);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.key.key._M_dataplus._M_p != &local_70.key.key.field_2) {
        operator_delete(local_70.key.key._M_dataplus._M_p,
                        local_70.key.key.field_2._M_allocated_capacity + 1);
      }
      pSVar2 = pSVar2 + 1;
    } while (pSVar2 != pSVar1);
  }
  if (this->totalBlockingDeps == 0) {
    ti_00.ctx = local_80.ctx;
    ti_00.impl = local_80.impl;
    performUnblockedRequest(this,ti_00);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // We reserve inputID=0 for the blocked DirectoryTreeSignature request.
    // inputID=1, 2, ... are used for mustScanAfterPaths
    for (auto mustScanAfterPath: node.getMustScanAfterPaths()) {
      ++totalBlockingDeps;
      ti.request(BuildKey::makeNode(mustScanAfterPath).toData(), totalBlockingDeps);
    }

    // If mustScanAfterPaths is empty, simply request DirectoryTreeSignature in start
    if (totalBlockingDeps == 0) {
      performUnblockedRequest(ti);
    }
  }